

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O3

bool CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_Parse
               (ConstStringParam name,VisionFeaturePrint_Scene_SceneVersion *value)

{
  pointer size;
  char *size_00;
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  int int_value;
  VisionFeaturePrint_Scene_SceneVersion local_1c;
  
  size = (name->_M_dataplus)._M_p;
  size_00 = (char *)name->_M_string_length;
  if ((long)size_00 < 0) {
    google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
              ((size_t)size_00,"string length exceeds max size");
  }
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = size_00;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)VisionFeaturePrint_Scene_SceneVersion_entries,(EnumEntry *)0x3,
                     (size_t)size,name_00,in_R9);
  if (bVar1) {
    *value = local_1c;
  }
  return bVar1;
}

Assistant:

bool VisionFeaturePrint_Scene_SceneVersion_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, VisionFeaturePrint_Scene_SceneVersion* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      VisionFeaturePrint_Scene_SceneVersion_entries, 3, name, &int_value);
  if (success) {
    *value = static_cast<VisionFeaturePrint_Scene_SceneVersion>(int_value);
  }
  return success;
}